

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

int listlocals(lua_State *L)

{
  StkId pTVar1;
  lua_CFunction p_Var2;
  Proto *f;
  int iVar3;
  lua_Integer lVar4;
  char *pcVar5;
  int pc;
  ravi_type_map tt;
  TString *usertype;
  ravi_type_map local_3c;
  TString *local_38;
  
  lVar4 = luaL_checkinteger(L,2);
  iVar3 = lua_type(L,1);
  if (iVar3 == 6) {
    iVar3 = lua_iscfunction(L,1);
    if (iVar3 == 0) goto LAB_00134c89;
  }
  luaL_argerror(L,1,"Lua function expected");
LAB_00134c89:
  pTVar1 = L->ci->func;
  if (pTVar1[1].tt_ == 0x8006) {
    p_Var2 = pTVar1[1].value_.f;
    if (p_Var2[8] == (_func_int_lua_State_ptr)0x6) {
      f = *(Proto **)(p_Var2 + 0x18);
      pc = (int)lVar4 + -1;
      pcVar5 = luaF_getlocalname(f,1,pc,&local_3c,&local_38);
      iVar3 = 0;
      if (pcVar5 != (char *)0x0) {
        do {
          lua_pushstring(L,pcVar5);
          pcVar5 = luaF_getlocalname(f,iVar3 + 2,pc,&local_3c,&local_38);
          iVar3 = iVar3 + 1;
        } while (pcVar5 != (char *)0x0);
      }
      return iVar3;
    }
    pcVar5 = "((((L->ci->func + (1)))->value_).gc)->tt == ((6) | ((0) << 4))";
  }
  else {
    pcVar5 = "(((((L->ci->func + (1))))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
  }
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x28b,"int listlocals(lua_State *)");
}

Assistant:

static int listlocals (lua_State *L) {
  Proto *p;
  int pc = cast_int(luaL_checkinteger(L, 2)) - 1;
  int i = 0;
  const char *name;
  ravi_type_map tt;
  TString *usertype;
  luaL_argcheck(L, lua_isfunction(L, 1) && !lua_iscfunction(L, 1),
                 1, "Lua function expected");
  p = getproto(obj_at(L, 1));
  while ((name = luaF_getlocalname(p, ++i, pc, &tt, &usertype)) != NULL)
    lua_pushstring(L, name);
  return i-1;
}